

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionBeamData.cpp
# Opt level: O3

void __thiscall
DIS::ElectromagneticEmissionBeamData::ElectromagneticEmissionBeamData
          (ElectromagneticEmissionBeamData *this)

{
  this->_vptr_ElectromagneticEmissionBeamData =
       (_func_int **)&PTR__ElectromagneticEmissionBeamData_0019fb90;
  this->_beamDataLength = '\0';
  this->_beamIDNumber = '\0';
  this->_beamParameterIndex = 0;
  FundamentalParameterData::FundamentalParameterData(&this->_fundamentalParameterData);
  (this->_trackJamTargets).
  super__Vector_base<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_trackJamTargets).
  super__Vector_base<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_beamFunction = '\0';
  this->_numberOfTrackJamTargets = '\0';
  this->_highDensityTrackJam = '\0';
  this->_pad4 = '\0';
  this->_jammingModeSequence = 0;
  (this->_trackJamTargets).
  super__Vector_base<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  return;
}

Assistant:

ElectromagneticEmissionBeamData::ElectromagneticEmissionBeamData():
   _beamDataLength(0), 
   _beamIDNumber(0), 
   _beamParameterIndex(0), 
   _fundamentalParameterData(), 
   _beamFunction(0), 
   _numberOfTrackJamTargets(0), 
   _highDensityTrackJam(0), 
   _pad4(0), 
   _jammingModeSequence(0)
{
}